

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O1

void FAudio_INTERNAL_Mix_2in_2out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float *src,float *dst,
               float *coefficients)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  
  if (toMix != 0) {
    fVar1 = *coefficients;
    fVar2 = coefficients[1];
    fVar3 = coefficients[2];
    fVar4 = coefficients[3];
    lVar5 = 0;
    do {
      *(ulong *)(dst + lVar5 * 2) =
           CONCAT44((float)((ulong)*(undefined8 *)(dst + lVar5 * 2) >> 0x20) +
                    src[lVar5 * 2] * fVar3 + src[lVar5 * 2 + 1] * fVar4,
                    (float)*(undefined8 *)(dst + lVar5 * 2) +
                    src[lVar5 * 2] * fVar1 + src[lVar5 * 2 + 1] * fVar2);
      lVar5 = lVar5 + 1;
    } while (toMix != (uint32_t)lVar5);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_2in_2out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i;
	for (i = 0; i < toMix; i += 1, src += 2, dst += 2)
	{
		dst[0] += (
			(src[0] * coefficients[0]) +
			(src[1] * coefficients[1])
		);
		dst[1] += (
			(src[0] * coefficients[2]) +
			(src[1] * coefficients[3])
		);
	}
}